

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

TryGetResult __thiscall capnp::SchemaLoader::Impl::tryGet(Impl *this,uint64_t typeId)

{
  ChunkHeader *pCVar1;
  size_t sVar2;
  Maybe<const_capnp::SchemaLoader::LazyLoadCallback_&> extraout_RDX;
  TryGetResult TVar3;
  size_t *local_28 [2];
  
  kj::HashMap<unsigned_long,capnp::_::RawSchema*>::find<unsigned_long&>
            ((HashMap<unsigned_long,capnp::_::RawSchema*> *)local_28,
             (unsigned_long *)(typeId + 0x68));
  if (local_28[0] == (size_t *)0x0) {
    sVar2 = 0;
  }
  else {
    sVar2 = *local_28[0];
  }
  pCVar1 = *(ChunkHeader **)(typeId + 0x198);
  (this->arena).nextChunkSize = sVar2;
  (this->arena).chunkList = pCVar1;
  TVar3.callback.ptr = extraout_RDX.ptr;
  TVar3.schema = (RawSchema *)this;
  return TVar3;
}

Assistant:

SchemaLoader::Impl::TryGetResult SchemaLoader::Impl::tryGet(uint64_t typeId) const {
  KJ_IF_SOME(schema, schemas.find(typeId)) {
    return {schema, initializer.getCallback()};
  } else {
    return {nullptr, initializer.getCallback()};
  }
}